

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers_test.cpp
# Opt level: O1

void __thiscall Sampler_ConsistentValues_Test::TestBody(Sampler_ConsistentValues_Test *this)

{
  undefined8 uVar1;
  Tuple2<pbrt::Point2,_float> TVar2;
  iterator __position;
  pointer pfVar3;
  void *pvVar4;
  short sVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  HaltonSampler *pHVar8;
  Allocator AVar9;
  undefined8 *puVar10;
  PaddedSobolSampler *pPVar11;
  PMJ02BNSampler *this_00;
  undefined4 *puVar12;
  uint uVar13;
  long lVar14;
  Tuple2<pbrt::Point2,_float> *pTVar15;
  char *pcVar16;
  ulong uVar17;
  int iVar18;
  DebugMLTSampler *pDVar19;
  int s;
  long lVar20;
  long lVar21;
  Float FVar22;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar23 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar39 [64];
  AssertionResult gtest_ar;
  Point2i resolution;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> samplers;
  vector<float,_std::allocator<float>_> s1d [16];
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> s2d [16];
  Tuple2<pbrt::Point2,_float> local_3d8;
  DispatchSplit<8> local_3cd;
  undefined1 local_3cc [4];
  AssertHelper AStack_3c8;
  undefined4 local_3bc;
  Point2<float> local_3b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_3b0;
  undefined4 *local_3a8;
  Tuple2<pbrt::Point2,_int> local_3a0;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> local_398;
  undefined8 local_378;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  Tuple2<pbrt::Point2,_float> *local_360;
  long local_358;
  long *local_350;
  Float local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  vector<float,_std::allocator<float>_> local_338;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  long alStack_1d0 [3];
  long local_1b8 [49];
  undefined1 auVar24 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  
  local_3a0.x = 100;
  local_3a0.y = 0x65;
  local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHVar8 = (HaltonSampler *)operator_new(0x48);
  AVar9.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::HaltonSampler::HaltonSampler
            (pHVar8,0x10,(Point2i *)&local_3a0,
             (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
              *)0x0,AVar9);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)pHVar8 | 0x1000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  puVar10 = (undefined8 *)operator_new(0x18);
  *puVar10 = 0x10;
  puVar10[1] = 0x853c49e6748fea9b;
  puVar10[2] = 0xda3e39cb94b95bdb;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)puVar10 | 0x4000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  pPVar11 = (PaddedSobolSampler *)operator_new(0x18);
  pbrt::PaddedSobolSampler::PaddedSobolSampler(pPVar11,0x10,None);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)pPVar11 | 0x2000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  pPVar11 = (PaddedSobolSampler *)operator_new(0x18);
  pbrt::PaddedSobolSampler::PaddedSobolSampler(pPVar11,0x10,CranleyPatterson);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)pPVar11 | 0x2000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  pPVar11 = (PaddedSobolSampler *)operator_new(0x18);
  pbrt::PaddedSobolSampler::PaddedSobolSampler(pPVar11,0x10,Xor);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)pPVar11 | 0x2000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  pPVar11 = (PaddedSobolSampler *)operator_new(0x18);
  pbrt::PaddedSobolSampler::PaddedSobolSampler(pPVar11,0x10,Owen);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)pPVar11 | 0x2000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  this_00 = (PMJ02BNSampler *)operator_new(0x20);
  AVar9.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::PMJ02BNSampler::PMJ02BNSampler(this_00,0x10,AVar9);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)this_00 | 0x3000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  puVar10 = (undefined8 *)operator_new(0x30);
  *puVar10 = 0x400000004;
  *(undefined1 *)(puVar10 + 1) = 1;
  *(undefined4 *)((long)puVar10 + 0xc) = 0;
  puVar10[2] = 0x853c49e6748fea9b;
  puVar10[3] = 0xda3e39cb94b95bdb;
  puVar10[4] = 0;
  puVar10[5] = 0;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)puVar10 | 0x6000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  puVar12 = (undefined4 *)operator_new(0x20);
  *puVar12 = 0x10;
  *(undefined8 *)(puVar12 + 2) = 0;
  *(undefined8 *)(puVar12 + 4) = 0;
  iVar18 = local_3a0.y;
  if (local_3a0.y < local_3a0.x) {
    iVar18 = local_3a0.x;
  }
  uVar13 = (int)(iVar18 - 1U) >> 1 | iVar18 - 1U;
  uVar13 = (int)uVar13 >> 2 | uVar13;
  uVar13 = (int)uVar13 >> 4 | uVar13;
  uVar13 = (int)uVar13 >> 8 | uVar13;
  puVar12[1] = ((int)uVar13 >> 0x10 | uVar13) + 1;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)puVar12 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  puVar12 = (undefined4 *)operator_new(0x20);
  *puVar12 = 0x10;
  puVar12[2] = 1;
  *(undefined8 *)(puVar12 + 3) = 0;
  puVar12[5] = 0;
  iVar18 = local_3a0.y;
  if (local_3a0.y < local_3a0.x) {
    iVar18 = local_3a0.x;
  }
  uVar13 = (int)(iVar18 - 1U) >> 1 | iVar18 - 1U;
  uVar13 = (int)uVar13 >> 2 | uVar13;
  uVar13 = (int)uVar13 >> 4 | uVar13;
  uVar13 = (int)uVar13 >> 8 | uVar13;
  puVar12[1] = ((int)uVar13 >> 0x10 | uVar13) + 1;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)puVar12 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  puVar12 = (undefined4 *)operator_new(0x20);
  *puVar12 = 0x10;
  puVar12[2] = 2;
  *(undefined8 *)(puVar12 + 3) = 0;
  puVar12[5] = 0;
  iVar18 = local_3a0.y;
  if (local_3a0.y < local_3a0.x) {
    iVar18 = local_3a0.x;
  }
  uVar13 = (int)(iVar18 - 1U) >> 1 | iVar18 - 1U;
  uVar13 = (int)uVar13 >> 2 | uVar13;
  uVar13 = (int)uVar13 >> 4 | uVar13;
  uVar13 = (int)uVar13 >> 8 | uVar13;
  puVar12[1] = ((int)uVar13 >> 0x10 | uVar13) + 1;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)puVar12 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  puVar12 = (undefined4 *)operator_new(0x20);
  *puVar12 = 0x10;
  puVar12[2] = 3;
  *(undefined8 *)(puVar12 + 3) = 0;
  puVar12[5] = 0;
  iVar18 = local_3a0.y;
  if (local_3a0.y < local_3a0.x) {
    iVar18 = local_3a0.x;
  }
  uVar13 = (int)(iVar18 - 1U) >> 1 | iVar18 - 1U;
  uVar13 = (int)uVar13 >> 2 | uVar13;
  uVar13 = (int)uVar13 >> 4 | uVar13;
  uVar13 = (int)uVar13 >> 8 | uVar13;
  puVar12[1] = ((int)uVar13 >> 0x10 | uVar13) + 1;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)puVar12 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  local_360 = (Tuple2<pbrt::Point2,_float> *)
              local_398.
              super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
              super__Vector_impl_data._M_finish;
  pTVar15 = (Tuple2<pbrt::Point2,_float> *)
            local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_1f8 = 0;
      uStack_1f0 = 0;
      uStack_1e8 = 0;
      uStack_1e0 = 0;
      uStack_1d8 = 0;
      alStack_1d0[0] = 0;
      alStack_1d0[1] = 0;
      alStack_1d0[2] = 0;
      local_238 = 0;
      uStack_230 = 0;
      uStack_228 = 0;
      uStack_220 = 0;
      uStack_218 = 0;
      uStack_210 = 0;
      uStack_208 = 0;
      uStack_200 = 0;
      local_278 = 0;
      uStack_270 = 0;
      uStack_268 = 0;
      uStack_260 = 0;
      uStack_258 = 0;
      uStack_250 = 0;
      uStack_248 = 0;
      uStack_240 = 0;
      local_2b8 = 0;
      uStack_2b0 = 0;
      uStack_2a8 = 0;
      uStack_2a0 = 0;
      uStack_298 = 0;
      uStack_290 = 0;
      uStack_288 = 0;
      uStack_280 = 0;
      local_2f8 = 0;
      uStack_2f0 = 0;
      uStack_2e8 = 0;
      uStack_2e0 = 0;
      uStack_2d8 = 0;
      uStack_2d0 = 0;
      uStack_2c8 = 0;
      uStack_2c0 = 0;
      local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uStack_320 = 0;
      uStack_318 = 0;
      uStack_310 = 0;
      uStack_308 = 0;
      uStack_300 = 0;
      local_1b8[0x28] = 0;
      local_1b8[0x29] = 0;
      local_1b8[0x2a] = 0;
      local_1b8[0x2b] = 0;
      local_1b8[0x2c] = 0;
      local_1b8[0x2d] = 0;
      local_1b8[0x2e] = 0;
      local_1b8[0x2f] = 0;
      local_1b8[0x20] = 0;
      local_1b8[0x21] = 0;
      local_1b8[0x22] = 0;
      local_1b8[0x23] = 0;
      local_1b8[0x24] = 0;
      local_1b8[0x25] = 0;
      local_1b8[0x26] = 0;
      local_1b8[0x27] = 0;
      local_1b8[0x18] = 0;
      local_1b8[0x19] = 0;
      local_1b8[0x1a] = 0;
      local_1b8[0x1b] = 0;
      local_1b8[0x1c] = 0;
      local_1b8[0x1d] = 0;
      local_1b8[0x1e] = 0;
      local_1b8[0x1f] = 0;
      local_1b8[0x10] = 0;
      local_1b8[0x11] = 0;
      local_1b8[0x12] = 0;
      local_1b8[0x13] = 0;
      local_1b8[0x14] = 0;
      local_1b8[0x15] = 0;
      local_1b8[0x16] = 0;
      local_1b8[0x17] = 0;
      local_1b8[8] = 0;
      local_1b8[9] = 0;
      local_1b8[10] = 0;
      local_1b8[0xb] = 0;
      local_1b8[0xc] = 0;
      local_1b8[0xd] = 0;
      local_1b8[0xe] = 0;
      local_1b8[0xf] = 0;
      local_1b8[0] = 0;
      local_1b8[1] = 0;
      local_1b8[2] = 0;
      local_1b8[3] = 0;
      local_1b8[4] = 0;
      local_1b8[5] = 0;
      local_1b8[6] = 0;
      local_1b8[7] = 0;
      lVar20 = 0;
      do {
        AStack_3c8.data_ = (AssertHelperData *)0x500000001;
        local_3cc = SUB84(lVar20,0);
        local_3bc = 0;
        local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ = SUB81(&AStack_3c8,0);
        local_3b8.super_Tuple2<pbrt::Point2,_float>._1_7_ = SUB87((ulong)&AStack_3c8 >> 8,0);
        sStack_3b0.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3cc;
        local_3a8 = &local_3bc;
        local_3d8 = *pTVar15;
        pbrt::detail::DispatchSplit<8>::operator()(&local_3cd,&local_3d8,(ulong)local_3d8 >> 0x30);
        iVar18 = 10;
        do {
          TVar2 = *pTVar15;
          sVar5 = TVar2.y._2_2_;
          if ((ulong)TVar2 < 0x5000000000000) {
            pHVar8 = (HaltonSampler *)((ulong)TVar2 & 0xffffffffffff);
            if ((ulong)TVar2 < 0x3000000000000) {
              if (sVar5 == 2) {
                auVar24._0_8_ = pbrt::PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar8);
                auVar24._8_56_ = extraout_var_01;
                auVar23 = auVar24._0_16_;
              }
              else {
                auVar28._0_8_ = pbrt::HaltonSampler::Get2D(pHVar8);
                auVar28._8_56_ = extraout_var_05;
                auVar23 = auVar28._0_16_;
              }
            }
            else if (sVar5 == 3) {
              auVar26._0_8_ = pbrt::PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar8);
              auVar26._8_56_ = extraout_var_03;
              auVar23 = auVar26._0_16_;
            }
            else {
              auVar30._0_8_ = pbrt::RandomSampler::Get2D((RandomSampler *)pHVar8);
              auVar30._8_56_ = extraout_var_07;
              auVar23 = auVar30._0_16_;
            }
          }
          else {
            pDVar19 = (DebugMLTSampler *)((ulong)TVar2 & 0xffffffffffff);
            if ((ulong)TVar2 < 0x7000000000000) {
              if (sVar5 == 6) {
                auVar25._0_8_ = pbrt::StratifiedSampler::Get2D((StratifiedSampler *)pDVar19);
                auVar25._8_56_ = extraout_var_02;
                auVar23 = auVar25._0_16_;
              }
              else {
                auVar29._0_8_ = pbrt::SobolSampler::Get2D((SobolSampler *)pDVar19);
                auVar29._8_56_ = extraout_var_06;
                auVar23 = auVar29._0_16_;
              }
            }
            else if (sVar5 == 7) {
              auVar27._0_8_ = pbrt::MLTSampler::Get2D((MLTSampler *)pDVar19);
              auVar27._8_56_ = extraout_var_04;
              auVar23 = auVar27._0_16_;
            }
            else {
              FVar22 = pbrt::DebugMLTSampler::Get1D(pDVar19);
              local_378._0_4_ = FVar22;
              local_378._4_4_ = extraout_XMM0_Db;
              uStack_370 = extraout_XMM0_Dc;
              uStack_36c = extraout_XMM0_Dd;
              auVar31._0_4_ = pbrt::DebugMLTSampler::Get1D(pDVar19);
              auVar31._4_60_ = extraout_var;
              auVar23._8_4_ = uStack_370;
              auVar23._0_8_ = local_378;
              auVar23._12_4_ = uStack_36c;
              auVar23 = vinsertps_avx(auVar23,auVar31._0_16_,0x10);
            }
          }
          uVar1 = vmovlps_avx(auVar23);
          local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ = SUB81(uVar1,0);
          local_3b8.super_Tuple2<pbrt::Point2,_float>._1_7_ = SUB87((ulong)uVar1 >> 8,0);
          std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
          emplace_back<pbrt::Point2<float>>
                    ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)
                     (local_1b8 + lVar20 * 3),&local_3b8);
          TVar2 = *pTVar15;
          local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ = TVar2.x._0_1_;
          local_3b8.super_Tuple2<pbrt::Point2,_float>._1_7_ = TVar2._1_7_;
          FVar22 = pbrt::detail::DispatchSplit<8>::operator()
                             ((DispatchSplit<8> *)&AStack_3c8,&local_3b8,(ulong)TVar2 >> 0x30);
          local_3d8.x = FVar22;
          __position._M_current =
               (&local_338)[lVar20].super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (&local_338)[lVar20].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_338 + lVar20,__position,&local_3d8.x);
          }
          else {
            *__position._M_current = FVar22;
            (&local_338)[lVar20].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x10);
      AStack_3c8.data_ = (AssertHelperData *)0x600000000;
      local_3cc = (undefined1  [4])0xa;
      local_3bc = 0;
      local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ = SUB81(&AStack_3c8,0);
      local_3b8.super_Tuple2<pbrt::Point2,_float>._1_7_ = SUB87((ulong)&AStack_3c8 >> 8,0);
      sStack_3b0.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3cc;
      local_3a8 = &local_3bc;
      local_3d8 = *pTVar15;
      pbrt::detail::DispatchSplit<8>::operator()(&local_3cd,&local_3d8,(ulong)local_3d8 >> 0x30);
      TVar2 = *pTVar15;
      sVar5 = TVar2.y._2_2_;
      if ((ulong)TVar2 < 0x5000000000000) {
        pHVar8 = (HaltonSampler *)((ulong)TVar2 & 0xffffffffffff);
        if ((ulong)TVar2 < 0x3000000000000) {
          if (sVar5 == 2) {
            pbrt::PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar8);
          }
          else {
            pbrt::HaltonSampler::Get2D(pHVar8);
          }
        }
        else if (sVar5 == 3) {
          pbrt::PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar8);
        }
        else {
          pbrt::RandomSampler::Get2D((RandomSampler *)pHVar8);
        }
      }
      else {
        pDVar19 = (DebugMLTSampler *)((ulong)TVar2 & 0xffffffffffff);
        if ((ulong)TVar2 < 0x7000000000000) {
          if (sVar5 == 6) {
            pbrt::StratifiedSampler::Get2D((StratifiedSampler *)pDVar19);
          }
          else {
            pbrt::SobolSampler::Get2D((SobolSampler *)pDVar19);
          }
        }
        else if (sVar5 == 7) {
          pbrt::MLTSampler::Get2D((MLTSampler *)pDVar19);
        }
        else {
          pbrt::DebugMLTSampler::Get1D(pDVar19);
          pbrt::DebugMLTSampler::Get1D(pDVar19);
        }
      }
      TVar2 = *pTVar15;
      sVar5 = TVar2.y._2_2_;
      if ((ulong)TVar2 < 0x5000000000000) {
        pHVar8 = (HaltonSampler *)((ulong)TVar2 & 0xffffffffffff);
        if ((ulong)TVar2 < 0x3000000000000) {
          if (sVar5 == 2) {
            pbrt::PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar8);
          }
          else {
            pbrt::HaltonSampler::Get2D(pHVar8);
          }
        }
        else if (sVar5 == 3) {
          pbrt::PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar8);
        }
        else {
          pbrt::RandomSampler::Get2D((RandomSampler *)pHVar8);
        }
      }
      else {
        pDVar19 = (DebugMLTSampler *)((ulong)TVar2 & 0xffffffffffff);
        if ((ulong)TVar2 < 0x7000000000000) {
          if (sVar5 == 6) {
            pbrt::StratifiedSampler::Get2D((StratifiedSampler *)pDVar19);
          }
          else {
            pbrt::SobolSampler::Get2D((SobolSampler *)pDVar19);
          }
        }
        else if (sVar5 == 7) {
          pbrt::MLTSampler::Get2D((MLTSampler *)pDVar19);
        }
        else {
          pbrt::DebugMLTSampler::Get1D(pDVar19);
          pbrt::DebugMLTSampler::Get1D(pDVar19);
        }
      }
      TVar2 = *pTVar15;
      local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ = TVar2.x._0_1_;
      local_3b8.super_Tuple2<pbrt::Point2,_float>._1_7_ = TVar2._1_7_;
      pbrt::detail::DispatchSplit<8>::operator()
                ((DispatchSplit<8> *)&local_3d8,&local_3b8,(ulong)TVar2 >> 0x30);
      lVar20 = 0xf;
      do {
        AStack_3c8.data_ = (AssertHelperData *)0x500000001;
        local_3cc = SUB84(lVar20,0);
        local_3bc = 0;
        local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ = SUB81(&AStack_3c8,0);
        local_3b8.super_Tuple2<pbrt::Point2,_float>._1_7_ = SUB87((ulong)&AStack_3c8 >> 8,0);
        sStack_3b0.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3cc;
        local_3a8 = &local_3bc;
        local_3d8 = *pTVar15;
        pbrt::detail::DispatchSplit<8>::operator()(&local_3cd,&local_3d8,(ulong)local_3d8 >> 0x30);
        lVar14 = local_1b8[lVar20 * 3];
        local_358 = lVar20;
        if (local_1b8[lVar20 * 3 + 1] != lVar14) {
          local_350 = local_1b8 + lVar20 * 3;
          local_378 = &local_338 + lVar20;
          lVar20 = 0;
          lVar21 = 0;
          uVar17 = 0;
          do {
            TVar2 = *pTVar15;
            sVar5 = TVar2.y._2_2_;
            if ((ulong)TVar2 < 0x5000000000000) {
              pHVar8 = (HaltonSampler *)((ulong)TVar2 & 0xffffffffffff);
              if ((ulong)TVar2 < 0x3000000000000) {
                if (sVar5 == 2) {
                  auVar32._0_8_ = pbrt::PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar8);
                  auVar32._8_56_ = extraout_var_08;
                  auVar23 = auVar32._0_16_;
                }
                else {
                  auVar36._0_8_ = pbrt::HaltonSampler::Get2D(pHVar8);
                  auVar36._8_56_ = extraout_var_12;
                  auVar23 = auVar36._0_16_;
                }
              }
              else if (sVar5 == 3) {
                auVar34._0_8_ = pbrt::PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar8);
                auVar34._8_56_ = extraout_var_10;
                auVar23 = auVar34._0_16_;
              }
              else {
                auVar38._0_8_ = pbrt::RandomSampler::Get2D((RandomSampler *)pHVar8);
                auVar38._8_56_ = extraout_var_14;
                auVar23 = auVar38._0_16_;
              }
            }
            else {
              pDVar19 = (DebugMLTSampler *)((ulong)TVar2 & 0xffffffffffff);
              if ((ulong)TVar2 < 0x7000000000000) {
                if (sVar5 == 6) {
                  auVar33._0_8_ = pbrt::StratifiedSampler::Get2D((StratifiedSampler *)pDVar19);
                  auVar33._8_56_ = extraout_var_09;
                  auVar23 = auVar33._0_16_;
                }
                else {
                  auVar37._0_8_ = pbrt::SobolSampler::Get2D((SobolSampler *)pDVar19);
                  auVar37._8_56_ = extraout_var_13;
                  auVar23 = auVar37._0_16_;
                }
              }
              else if (sVar5 == 7) {
                auVar35._0_8_ = pbrt::MLTSampler::Get2D((MLTSampler *)pDVar19);
                auVar35._8_56_ = extraout_var_11;
                auVar23 = auVar35._0_16_;
              }
              else {
                local_348 = pbrt::DebugMLTSampler::Get1D(pDVar19);
                uStack_344 = extraout_XMM0_Db_00;
                uStack_340 = extraout_XMM0_Dc_00;
                uStack_33c = extraout_XMM0_Dd_00;
                auVar39._0_4_ = pbrt::DebugMLTSampler::Get1D(pDVar19);
                auVar39._4_60_ = extraout_var_00;
                auVar6._4_4_ = uStack_344;
                auVar6._0_4_ = local_348;
                auVar6._8_4_ = uStack_340;
                auVar6._12_4_ = uStack_33c;
                auVar23 = vinsertps_avx(auVar6,auVar39._0_16_,0x10);
              }
            }
            local_3d8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar23);
            testing::internal::CmpHelperEQ<pbrt::Point2<float>,pbrt::Point2<float>>
                      ((internal *)&local_3b8,"s2d[s][i]","sampler.Get2D()",
                       (Point2<float> *)(lVar14 + lVar20),(Point2<float> *)&local_3d8);
            if (local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_3d8);
              pcVar16 = "";
              if (sStack_3b0.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar16 = ((sStack_3b0.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&AStack_3c8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/samplers_test.cpp"
                         ,0x3c,pcVar16);
              testing::internal::AssertHelper::operator=(&AStack_3c8,(Message *)&local_3d8);
              testing::internal::AssertHelper::~AssertHelper(&AStack_3c8);
              if (local_3d8 != (Tuple2<pbrt::Point2,_float>)0x0) {
                bVar7 = testing::internal::IsTrue(true);
                if ((bVar7) && (local_3d8 != (Tuple2<pbrt::Point2,_float>)0x0)) {
                  (**(code **)(*(long *)local_3d8 + 8))();
                }
                local_3d8.x = 0.0;
                local_3d8.y = 0.0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&sStack_3b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            pfVar3 = (local_378->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            local_3d8 = *pTVar15;
            FVar22 = pbrt::detail::DispatchSplit<8>::operator()
                               ((DispatchSplit<8> *)local_3cc,&local_3d8,(ulong)local_3d8 >> 0x30);
            AStack_3c8.data_._0_4_ = FVar22;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&local_3b8,"s1d[s][i]","sampler.Get1D()",
                       (float *)((long)pfVar3 + lVar21),(float *)&AStack_3c8);
            if (local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_3d8);
              pcVar16 = "";
              if (sStack_3b0.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar16 = ((sStack_3b0.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&AStack_3c8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/samplers_test.cpp"
                         ,0x3d,pcVar16);
              testing::internal::AssertHelper::operator=(&AStack_3c8,(Message *)&local_3d8);
              testing::internal::AssertHelper::~AssertHelper(&AStack_3c8);
              if (local_3d8 != (Tuple2<pbrt::Point2,_float>)0x0) {
                bVar7 = testing::internal::IsTrue(true);
                if ((bVar7) && (local_3d8 != (Tuple2<pbrt::Point2,_float>)0x0)) {
                  (**(code **)(*(long *)local_3d8 + 8))();
                }
                local_3d8.x = 0.0;
                local_3d8.y = 0.0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&sStack_3b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            uVar17 = uVar17 + 1;
            lVar14 = *local_350;
            lVar21 = lVar21 + 4;
            lVar20 = lVar20 + 8;
          } while (uVar17 < (ulong)(local_350[1] - lVar14 >> 3));
        }
        lVar20 = local_358 + -1;
      } while (local_358 != 0);
      lVar20 = 0x180;
      do {
        pvVar4 = *(void **)((long)alStack_1d0 + lVar20);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,*(long *)((long)alStack_1d0 + lVar20 + 0x10) - (long)pvVar4);
        }
        lVar20 = lVar20 + -0x18;
      } while (lVar20 != 0);
      lVar20 = 0x180;
      do {
        pvVar4 = *(void **)((long)&local_350 + lVar20);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,*(long *)((long)&uStack_340 + lVar20) - (long)pvVar4);
        }
        lVar20 = lVar20 + -0x18;
      } while (lVar20 != 0);
      pTVar15 = pTVar15 + 1;
    } while (pTVar15 != local_360);
  }
  if ((Tuple2<pbrt::Point2,_float> *)
      local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
      _M_impl.super__Vector_impl_data._M_start != (Tuple2<pbrt::Point2,_float> *)0x0) {
    operator_delete(local_398.
                    super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_398.
                          super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.
                          super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Sampler, ConsistentValues) {
    constexpr int rootSpp = 4;
    constexpr int spp = rootSpp * rootSpp;
    Point2i resolution(100, 101);

    std::vector<SamplerHandle> samplers;
    samplers.push_back(new HaltonSampler(spp, resolution));
    samplers.push_back(new RandomSampler(spp));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::None));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::CranleyPatterson));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::Xor));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::Owen));
    samplers.push_back(new PMJ02BNSampler(spp));
    samplers.push_back(new StratifiedSampler(rootSpp, rootSpp, true));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::None));
    samplers.push_back(
        new SobolSampler(spp, resolution, RandomizeStrategy::CranleyPatterson));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::Xor));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::Owen));

    for (auto &sampler : samplers) {
        std::vector<Float> s1d[spp];
        std::vector<Point2f> s2d[spp];

        for (int s = 0; s < spp; ++s) {
            sampler.StartPixelSample({1, 5}, s);
            for (int i = 0; i < 10; ++i) {
                s2d[s].push_back(sampler.Get2D());
                s1d[s].push_back(sampler.Get1D());
            }
        }

        // Go somewhere else and generate some samples, just to make sure
        // things are shaken up.
        sampler.StartPixelSample({0, 6}, 10);
        sampler.Get2D();
        sampler.Get2D();
        sampler.Get1D();

        // Now go back and generate samples again, but enumerate them in a
        // different order to make sure the sampler is doing the right
        // thing.
        for (int s = spp - 1; s >= 0; --s) {
            sampler.StartPixelSample({1, 5}, s);
            for (int i = 0; i < s2d[s].size(); ++i) {
                EXPECT_EQ(s2d[s][i], sampler.Get2D());
                EXPECT_EQ(s1d[s][i], sampler.Get1D());
            }
        }
    }
}